

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::reportAabbOverlappingNodex
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  cbtTraversalMode cVar1;
  unsigned_short quantizedQueryAabbMax [3];
  unsigned_short quantizedQueryAabbMin [3];
  
  if (this->m_useQuantization == true) {
    quantizeWithClamp(this,quantizedQueryAabbMin,aabbMin,0);
    quantizeWithClamp(this,quantizedQueryAabbMax,aabbMax,1);
    cVar1 = this->m_traversalMode;
    if (cVar1 == TRAVERSAL_RECURSIVE) {
      walkRecursiveQuantizedTreeAgainstQueryAabb
                (this,(this->m_quantizedContiguousNodes).m_data,nodeCallback,quantizedQueryAabbMin,
                 quantizedQueryAabbMax);
    }
    else if (cVar1 == TRAVERSAL_STACKLESS_CACHE_FRIENDLY) {
      walkStacklessQuantizedTreeCacheFriendly
                (this,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
    }
    else if (cVar1 == TRAVERSAL_STACKLESS) {
      walkStacklessQuantizedTree
                (this,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax,0,
                 this->m_curNodeIndex);
    }
    return;
  }
  walkStacklessTree(this,nodeCallback,aabbMin,aabbMax);
  return;
}

Assistant:

void cbtQuantizedBvh::reportAabbOverlappingNodex(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
	//either choose recursive traversal (walkTree) or stackless (walkStacklessTree)

	if (m_useQuantization)
	{
		///quantize query AABB
		unsigned short int quantizedQueryAabbMin[3];
		unsigned short int quantizedQueryAabbMax[3];
		quantizeWithClamp(quantizedQueryAabbMin, aabbMin, 0);
		quantizeWithClamp(quantizedQueryAabbMax, aabbMax, 1);

		switch (m_traversalMode)
		{
			case TRAVERSAL_STACKLESS:
				walkStacklessQuantizedTree(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax, 0, m_curNodeIndex);
				break;
			case TRAVERSAL_STACKLESS_CACHE_FRIENDLY:
				walkStacklessQuantizedTreeCacheFriendly(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
				break;
			case TRAVERSAL_RECURSIVE:
			{
				const cbtQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[0];
				walkRecursiveQuantizedTreeAgainstQueryAabb(rootNode, nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
			}
			break;
			default:
				//unsupported
				cbtAssert(0);
		}
	}
	else
	{
		walkStacklessTree(nodeCallback, aabbMin, aabbMax);
	}
}